

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O1

int history_save_fp(History *h,size_t nelem,FILE *fp)

{
  char *mbsrc;
  int iVar1;
  long lVar2;
  char *mbdst;
  size_t sVar3;
  char *pcVar4;
  ulong __size;
  uint uVar5;
  HistEvent ev;
  HistEvent HStack_48;
  FILE *local_38;
  
  lVar2 = ftell((FILE *)fp);
  if (((lVar2 == 0) && (iVar1 = fputs("_HiStOrY_V2_\n",(FILE *)fp), iVar1 == -1)) ||
     (mbdst = (char *)malloc(0x400), mbdst == (char *)0x0)) {
    return -1;
  }
  if ((nelem == 0xffffffffffffffff) || (iVar1 = (*h->h_first)(h->h_ref,&HStack_48), iVar1 == -1)) {
LAB_0010b851:
    iVar1 = (*h->h_last)(h->h_ref,&HStack_48);
    if (iVar1 == -1) {
      uVar5 = 0;
      goto LAB_0010b8fa;
    }
  }
  else if (nelem != 0) {
    do {
      iVar1 = (*h->h_next)(h->h_ref,&HStack_48);
      if (iVar1 == -1) goto LAB_0010b851;
      nelem = nelem - 1;
    } while (nelem != 0);
  }
  __size = 0x400;
  uVar5 = 0;
  local_38 = (FILE *)fp;
  do {
    mbsrc = HStack_48.str;
    sVar3 = strlen(HStack_48.str);
    pcVar4 = mbdst;
    if (__size <= sVar3 * 4) {
      __size = sVar3 * 4 + 0x401 & 0xfffffffffffffc00;
      pcVar4 = (char *)realloc(mbdst,__size);
      uVar5 = uVar5 | -(uint)(pcVar4 == (char *)0x0);
      if (pcVar4 == (char *)0x0) break;
    }
    mbdst = pcVar4;
    strvis(mbdst,mbsrc,L'\x1c');
    fprintf(local_38,"%s\n",mbdst);
    iVar1 = (*h->h_prev)(h->h_ref,&HStack_48);
    uVar5 = uVar5 + 1;
  } while (iVar1 != -1);
LAB_0010b8fa:
  free(mbdst);
  return uVar5;
}

Assistant:

static int
history_save_fp(TYPE(History) *h, size_t nelem, FILE *fp)
{
	TYPE(HistEvent) ev;
	int i = -1, retval;
	size_t len, max_size;
	char *ptr;
	const char *str;
#ifndef NARROWCHAR
	static ct_buffer_t conv;
#endif

	if (ftell(fp) == 0 && fputs(hist_cookie, fp) == EOF)
		goto done;
	ptr = h_malloc((max_size = 1024) * sizeof(*ptr));
	if (ptr == NULL)
		goto done;
	if (nelem != (size_t)-1) {
		for (retval = HFIRST(h, &ev); retval != -1 && nelem-- > 0;
		    retval = HNEXT(h, &ev))
			continue;
	} else
		retval = -1;

	if (retval == -1)
		retval = HLAST(h, &ev);

	for (i = 0; retval != -1; retval = HPREV(h, &ev), i++) {
		str = ct_encode_string(ev.str, &conv);
		len = strlen(str) * 4 + 1;
		if (len > max_size) {
			char *nptr;
			max_size = (len + 1024) & (size_t)~1023;
			nptr = h_realloc(ptr, max_size * sizeof(*ptr));
			if (nptr == NULL) {
				i = -1;
				goto oomem;
			}
			ptr = nptr;
		}
		(void) strvis(ptr, str, VIS_WHITE);
		(void) fprintf(fp, "%s\n", ptr);
	}
oomem:
	h_free(ptr);
done:
	return i;
}